

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O1

void __thiscall
btAlignedObjectArray<btSolverConstraint_*>::~btAlignedObjectArray
          (btAlignedObjectArray<btSolverConstraint_*> *this)

{
  if (this->m_data != (btSolverConstraint **)0x0) {
    if (this->m_ownsMemory == true) {
      btAlignedFreeInternal(this->m_data);
    }
    this->m_data = (btSolverConstraint **)0x0;
  }
  this->m_ownsMemory = true;
  this->m_data = (btSolverConstraint **)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  return;
}

Assistant:

~btAlignedObjectArray()
		{
			clear();
		}